

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_cookie.cpp
# Opt level: O2

void __thiscall cppcms::http::cookie::cookie(cookie *this,string *name,string *value,uint age)

{
  (this->d).ptr_ = (_data *)0x0;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  std::__cxx11::string::string((string *)&this->value_,(string *)value);
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  (this->path_)._M_string_length = 0;
  (this->path_).field_2._M_local_buf[0] = '\0';
  (this->domain_)._M_dataplus._M_p = (pointer)&(this->domain_).field_2;
  (this->domain_)._M_string_length = 0;
  (this->domain_).field_2._M_local_buf[0] = '\0';
  (this->comment_)._M_dataplus._M_p = (pointer)&(this->comment_).field_2;
  (this->comment_)._M_string_length = 0;
  (this->comment_).field_2._M_local_buf[0] = '\0';
  this->max_age_ = age;
  *(uint *)&this->field_0xb8 = *(uint *)&this->field_0xb8 & 0xffffff80 | 2;
  return;
}

Assistant:

cookie::cookie(std::string name,std::string value,unsigned age) :
	name_(name), value_(value), max_age_(age), secure_(0), has_age_(1), has_expiration_(0), httponly_(0), samesite_none_(0), samesite_lax_(0), samesite_strict_(0)
{
}